

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

void __thiscall mkvparser::Chapters::Atom::Clear(Atom *this)

{
  Display *pDVar1;
  Display *this_00;
  int iVar2;
  Display *d;
  Atom *this_local;
  
  if (this->m_string_uid != (char *)0x0) {
    operator_delete__(this->m_string_uid);
  }
  this->m_string_uid = (char *)0x0;
  while (0 < this->m_displays_count) {
    iVar2 = this->m_displays_count + -1;
    this->m_displays_count = iVar2;
    Display::Clear(this->m_displays + iVar2);
  }
  pDVar1 = this->m_displays;
  if (pDVar1 != (Display *)0x0) {
    this_00 = pDVar1 + (long)pDVar1[-1].m_country;
    while (pDVar1 != this_00) {
      this_00 = this_00 + -1;
      Display::~Display(this_00);
    }
    operator_delete__(&pDVar1[-1].m_country);
  }
  this->m_displays = (Display *)0x0;
  this->m_displays_size = 0;
  return;
}

Assistant:

void Chapters::Atom::Clear() {
  delete[] m_string_uid;
  m_string_uid = NULL;

  while (m_displays_count > 0) {
    Display& d = m_displays[--m_displays_count];
    d.Clear();
  }

  delete[] m_displays;
  m_displays = NULL;

  m_displays_size = 0;
}